

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_expose.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char *format;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ALLEGRO_EVENT event;
  
  cVar3 = al_install_system(0x5020700,atexit);
  if (cVar3 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_init_primitives_addon();
    al_init_image_addon();
    al_install_keyboard();
    al_install_mouse();
    al_set_new_display_flags(0x50);
    al_set_new_display_option(0x16,1);
    lVar5 = al_create_display(0x140,200);
    if (lVar5 == 0) {
      format = "Error creating display\n";
    }
    else {
      lVar6 = al_load_bitmap("data/mysha.pcx");
      if (lVar6 != 0) {
        al_draw_bitmap(0,0,lVar6,0);
        al_flip_display();
        uVar7 = al_create_timer(0x3fb999999999999a);
        uVar8 = al_create_event_queue();
        uVar9 = al_get_keyboard_event_source();
        al_register_event_source(uVar8,uVar9);
        uVar9 = al_get_mouse_event_source();
        al_register_event_source(uVar8,uVar9);
        uVar9 = al_get_display_event_source(lVar5);
        al_register_event_source(uVar8,uVar9);
        uVar9 = al_get_timer_event_source(uVar7);
        al_register_event_source(uVar8,uVar9);
        al_start_timer(uVar7);
        while( true ) {
          al_wait_for_event(uVar8,&event);
          if ((event.type == 0x2a) || ((event.type == 10 && (event.display.width == 0x3b)))) break;
          if (event.type == 0x29) {
            al_acknowledge_resize(event.any.source);
          }
          uVar2 = event.display.y;
          uVar1 = event.display.x;
          if (event.type == 0x28) {
            iVar10 = event.display.width + event.display.x;
            iVar11 = event.display.height + event.display.y;
            al_set_blender(0,1,0);
            uVar13 = 0;
            uVar12 = al_map_rgba_f(0x3f800000,0,0,0x3f800000);
            al_draw_filled_rectangle
                      ((float)(int)uVar1,(float)(int)uVar2,(float)iVar10,(float)iVar11,uVar12,uVar13
                      );
            al_flip_display();
          }
          if (event.type == 0x1e) {
            iVar10 = 0;
            al_set_blender(0,2,3);
            while( true ) {
              iVar11 = al_get_display_height(lVar5);
              if (iVar11 <= iVar10) break;
              iVar11 = 0;
              while( true ) {
                iVar4 = al_get_display_width(lVar5);
                if (iVar4 <= iVar11) break;
                al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,0x3dcccccd);
                al_draw_tinted_bitmap(lVar6,0);
                iVar11 = iVar11 + 0x140;
              }
              iVar10 = iVar10 + 200;
            }
            al_flip_display();
          }
        }
        al_destroy_event_queue(uVar8);
        al_destroy_bitmap(lVar6);
        return 0;
      }
      format = "mysha.pcx not found or failed to load\n";
    }
  }
  abort_example(format);
  iVar10 = __cxa_atexit();
  return iVar10;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bitmap;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_init_primitives_addon();
   al_init_image_addon();
   al_install_keyboard();
   al_install_mouse();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_RESIZABLE |
      ALLEGRO_GENERATE_EXPOSE_EVENTS);
   al_set_new_display_option(ALLEGRO_SINGLE_BUFFER, true, ALLEGRO_REQUIRE);
   display = al_create_display(320, 200);
   if (!display) {
      abort_example("Error creating display\n");
   }

   bitmap = al_load_bitmap("data/mysha.pcx");
   if (!bitmap) {
      abort_example("mysha.pcx not found or failed to load\n");
   }
   al_draw_bitmap(bitmap, 0, 0, 0);
   al_flip_display();

   timer = al_create_timer(0.1);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_start_timer(timer);

   while (true) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE)
            break;
      if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
         event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(event.display.source);
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_EXPOSE) {
         int x = event.display.x,
            y = event.display.y, 
            w = event.display.width,
            h = event.display.height;
         /* Draw a red rectangle over the damaged area. */
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
         al_draw_filled_rectangle(x, y, x + w, y + h, al_map_rgba_f(1, 0, 0, 1));
         al_flip_display();
      }
      if (event.type == ALLEGRO_EVENT_TIMER) {
         /* Slowly restore the original bitmap. */
         int x, y;
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ALPHA, ALLEGRO_INVERSE_ALPHA);
         for (y = 0; y < al_get_display_height(display); y += 200) {
            for (x = 0; x < al_get_display_width(display); x += 320) {
               al_draw_tinted_bitmap(bitmap, al_map_rgba_f(1, 1, 1, 0.1), x, y, 0);
            }
         }
         al_flip_display();
      }
   }

   al_destroy_event_queue(queue);
   al_destroy_bitmap(bitmap);

   return 0;
}